

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

void __thiscall
pbrt::GridMedium::GridMedium
          (GridMedium *this,Bounds3f *bounds,Transform *renderFromMedium,Spectrum *sigma_a,
          Spectrum *sigma_s,Float sigmaScale,Float g,SampledGrid<float> *d,
          optional<pbrt::SampledGrid<float>_> *temperature,Float temperatureScale,
          Float temperatureOffset,Spectrum *Le,SampledGrid<float> *LeGrid,Allocator alloc)

{
  Allocator alloc_00;
  Allocator alloc_01;
  Allocator alloc_02;
  Allocator alloc_03;
  Point3i res;
  Bounds3f bounds_00;
  bool bVar1;
  size_t sVar2;
  undefined1 (*in_RDX) [64];
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  long *in_FS_OFFSET;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Float FVar5;
  Float in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  Bounds3f bounds_1;
  int x;
  int y;
  int z;
  SampledGrid<float> *in_stack_fffffffffffffe28;
  Bounds3f *bounds_01;
  SampledGrid<float> *in_stack_fffffffffffffe30;
  SampledGrid<float> *this_00;
  optional<pbrt::SampledGrid<float>_> *in_stack_fffffffffffffe38;
  undefined8 uVar6;
  MajorantGrid *in_stack_fffffffffffffe40;
  MajorantGrid *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  bool local_19a;
  int in_stack_fffffffffffffe6c;
  undefined8 in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 *puVar7;
  undefined8 *puVar8;
  MajorantGrid *this_01;
  int local_dc;
  int local_d8;
  int local_d4;
  
  in_RDI[2] = in_RSI[2];
  uVar6 = in_RSI[1];
  *in_RDI = *in_RSI;
  in_RDI[1] = uVar6;
  auVar3 = vmovdqu64_avx512f(*in_RDX);
  auVar4 = vmovdqu64_avx512f(in_RDX[1]);
  auVar4 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])(in_RDI + 0xb) = auVar4;
  auVar4 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])(in_RDI + 3) = auVar4;
  Spectrum::Spectrum((Spectrum *)in_stack_fffffffffffffe30,(Spectrum *)in_stack_fffffffffffffe28);
  alloc_00.memoryResource._4_4_ = in_stack_fffffffffffffe54;
  alloc_00.memoryResource._0_4_ = in_stack_fffffffffffffe50;
  DenselySampledSpectrum::DenselySampledSpectrum
            ((DenselySampledSpectrum *)in_stack_fffffffffffffe48,
             (Spectrum *)in_stack_fffffffffffffe40,alloc_00);
  Spectrum::Spectrum((Spectrum *)in_stack_fffffffffffffe30,(Spectrum *)in_stack_fffffffffffffe28);
  alloc_01.memoryResource._4_4_ = in_stack_fffffffffffffe54;
  alloc_01.memoryResource._0_4_ = in_stack_fffffffffffffe50;
  DenselySampledSpectrum::DenselySampledSpectrum
            ((DenselySampledSpectrum *)in_stack_fffffffffffffe48,
             (Spectrum *)in_stack_fffffffffffffe40,alloc_01);
  SampledGrid<float>::SampledGrid(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  HGPhaseFunction::HGPhaseFunction((HGPhaseFunction *)(in_RDI + 0x23),in_XMM1_Da);
  pstd::optional<pbrt::SampledGrid<float>_>::optional
            ((optional<pbrt::SampledGrid<float>_> *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38);
  this_01 = (MajorantGrid *)(in_RDI + 0x2b);
  Spectrum::Spectrum((Spectrum *)in_stack_fffffffffffffe30,(Spectrum *)in_stack_fffffffffffffe28);
  alloc_02.memoryResource._4_4_ = in_stack_fffffffffffffe54;
  alloc_02.memoryResource._0_4_ = in_stack_fffffffffffffe50;
  DenselySampledSpectrum::DenselySampledSpectrum
            ((DenselySampledSpectrum *)in_stack_fffffffffffffe48,
             (Spectrum *)in_stack_fffffffffffffe40,alloc_02);
  puVar8 = in_RDI + 0x30;
  SampledGrid<float>::SampledGrid(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *(undefined4 *)((long)in_RDI + 0x1b4) = in_XMM2_Da;
  *(undefined4 *)(in_RDI + 0x37) = in_XMM3_Da;
  puVar7 = in_RDI + 0x38;
  uVar6 = in_RSI[2];
  bounds_01 = (Bounds3f *)*in_RSI;
  this_00 = (SampledGrid<float> *)in_RSI[1];
  Point3<int>::Point3((Point3<int> *)in_stack_fffffffffffffe30,
                      (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),(int)in_stack_fffffffffffffe28
                      ,0);
  bounds_00.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffe88;
  bounds_00.pMax.super_Tuple3<pbrt::Point3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  bounds_00.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffe80;
  bounds_00.pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  bounds_00.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)puVar7;
  bounds_00.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)((ulong)puVar7 >> 0x20);
  res.super_Tuple3<pbrt::Point3,_int>.y = (int)in_stack_fffffffffffffe70;
  res.super_Tuple3<pbrt::Point3,_int>.z = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  res.super_Tuple3<pbrt::Point3,_int>.x = in_stack_fffffffffffffe6c;
  alloc_03.memoryResource._4_4_ = in_stack_fffffffffffffe54;
  alloc_03.memoryResource._0_4_ = in_stack_fffffffffffffe50;
  MajorantGrid::MajorantGrid(in_stack_fffffffffffffe48,bounds_00,res,alloc_03);
  FVar5 = (Float)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  DenselySampledSpectrum::Scale
            ((DenselySampledSpectrum *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
             ,FVar5);
  DenselySampledSpectrum::Scale
            ((DenselySampledSpectrum *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
             ,FVar5);
  sVar2 = SampledGrid<float>::BytesAllocated((SampledGrid<float> *)0x90b17f);
  in_FS_OFFSET[-4] = in_FS_OFFSET[-4] + sVar2;
  sVar2 = SampledGrid<float>::BytesAllocated((SampledGrid<float> *)0x90b1b4);
  in_FS_OFFSET[-4] = in_FS_OFFSET[-4] + sVar2;
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(in_RDI + 0x24));
  if (bVar1) {
    pstd::optional<pbrt::SampledGrid<float>_>::operator->
              ((optional<pbrt::SampledGrid<float>_> *)0x90b210);
    sVar2 = SampledGrid<float>::BytesAllocated((SampledGrid<float> *)0x90b221);
    *(long *)(*in_FS_OFFSET + -0x20) = sVar2 + *(long *)(*in_FS_OFFSET + -0x20);
  }
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(in_RDI + 0x24));
  if (bVar1) {
    local_19a = true;
  }
  else {
    FVar5 = DenselySampledSpectrum::MaxValue((DenselySampledSpectrum *)this_00);
    local_19a = 0.0 < FVar5;
  }
  *(bool *)(in_RDI + 0x36) = local_19a;
  for (local_d4 = 0; local_d4 < *(int *)(in_RDI + 0x40); local_d4 = local_d4 + 1) {
    for (local_d8 = 0; local_d8 < *(int *)((long)in_RDI + 0x1fc); local_d8 = local_d8 + 1) {
      for (local_dc = 0; local_dc < *(int *)(in_RDI + 0x3f); local_dc = local_dc + 1) {
        MajorantGrid::VoxelBounds
                  (this_01,(int)((ulong)puVar8 >> 0x20),(int)puVar8,(int)((ulong)puVar7 >> 0x20));
        SampledGrid<float>::MaxValue(this_00,bounds_01);
        MajorantGrid::Set(in_stack_fffffffffffffe40,(int)((ulong)uVar6 >> 0x20),(int)uVar6,
                          (int)((ulong)this_00 >> 0x20),SUB84(this_00,0));
      }
    }
  }
  return;
}

Assistant:

GridMedium::GridMedium(const Bounds3f &bounds, const Transform &renderFromMedium,
                       Spectrum sigma_a, Spectrum sigma_s, Float sigmaScale, Float g,
                       SampledGrid<Float> d,
                       pstd::optional<SampledGrid<Float>> temperature,
                       Float temperatureScale, Float temperatureOffset,
                       Spectrum Le, SampledGrid<Float> LeGrid, Allocator alloc)
    : bounds(bounds),
      renderFromMedium(renderFromMedium),
      sigma_a_spec(sigma_a, alloc),
      sigma_s_spec(sigma_s, alloc),
      densityGrid(std::move(d)),
      phase(g),
      temperatureGrid(std::move(temperature)),
      temperatureScale(temperatureScale),
      temperatureOffset(temperatureOffset),
      Le_spec(Le, alloc),
      LeScale(std::move(LeGrid)),
      majorantGrid(bounds, {16, 16, 16}, alloc) {
    sigma_a_spec.Scale(sigmaScale);
    sigma_s_spec.Scale(sigmaScale);

    volumeGridBytes += LeScale.BytesAllocated();
    volumeGridBytes += densityGrid.BytesAllocated();
    if (temperatureGrid)
        volumeGridBytes += temperatureGrid->BytesAllocated();

    isEmissive = temperatureGrid ? true : (Le_spec.MaxValue() > 0);

    // Initialize _majorantGrid_ for _GridMedium_
    for (int z = 0; z < majorantGrid.res.z; ++z)
        for (int y = 0; y < majorantGrid.res.y; ++y)
            for (int x = 0; x < majorantGrid.res.x; ++x) {
                Bounds3f bounds = majorantGrid.VoxelBounds(x, y, z);
                majorantGrid.Set(x, y, z, densityGrid.MaxValue(bounds));
            }
}